

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_cache.cpp
# Opt level: O2

int64_t __thiscall
libtorrent::aux::stat_cache::get_filesize
          (stat_cache *this,file_index_t i,file_storage *fs,string *save_path,error_code *ec)

{
  pointer peVar1;
  error_category *peVar2;
  bool bVar3;
  undefined3 uVar4;
  file_flags_t fVar5;
  pointer psVar6;
  long lVar7;
  file_status s;
  string file_path;
  
  fVar5 = file_storage::file_flags(fs,i);
  if ((fVar5.m_val & 8) == 0) {
    ::std::mutex::lock(&this->m_mutex);
    psVar6 = (this->m_stat_cache).
             super_vector<libtorrent::aux::stat_cache::stat_cache_t,_std::allocator<libtorrent::aux::stat_cache::stat_cache_t>_>
             .
             super__Vector_base<libtorrent::aux::stat_cache::stat_cache_t,_std::allocator<libtorrent::aux::stat_cache::stat_cache_t>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(this->m_stat_cache).
                            super_vector<libtorrent::aux::stat_cache::stat_cache_t,_std::allocator<libtorrent::aux::stat_cache::stat_cache_t>_>
                            .
                            super__Vector_base<libtorrent::aux::stat_cache::stat_cache_t,_std::allocator<libtorrent::aux::stat_cache::stat_cache_t>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)psVar6) >> 3) <=
        i.m_val) {
      s.file_size = -1;
      container_wrapper<libtorrent::aux::stat_cache::stat_cache_t,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::aux::stat_cache::stat_cache_t,std::allocator<libtorrent::aux::stat_cache::stat_cache_t>>>
      ::resize<int,void>((container_wrapper<libtorrent::aux::stat_cache::stat_cache_t,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::aux::stat_cache::stat_cache_t,std::allocator<libtorrent::aux::stat_cache::stat_cache_t>>>
                          *)&this->m_stat_cache,i.m_val + 1,(stat_cache_t *)&s);
      psVar6 = (this->m_stat_cache).
               super_vector<libtorrent::aux::stat_cache::stat_cache_t,_std::allocator<libtorrent::aux::stat_cache::stat_cache_t>_>
               .
               super__Vector_base<libtorrent::aux::stat_cache::stat_cache_t,_std::allocator<libtorrent::aux::stat_cache::stat_cache_t>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    lVar7 = psVar6[i.m_val].file_size;
    if (lVar7 < -1) {
      peVar1 = (this->m_errors).
               super__Vector_base<boost::system::error_code,_std::allocator<boost::system::error_code>_>
               ._M_impl.super__Vector_impl_data._M_start + (-2 - lVar7);
      bVar3 = peVar1->failed_;
      uVar4 = *(undefined3 *)&peVar1->field_0x5;
      peVar2 = peVar1->cat_;
      ec->val_ = peVar1->val_;
      ec->failed_ = bVar3;
      *(undefined3 *)&ec->field_0x5 = uVar4;
      ec->cat_ = peVar2;
      lVar7 = -2;
    }
    else if (lVar7 == -1) {
      s.mtime = 0;
      s.ctime = 0;
      s.file_size = 0;
      s.atime = 0;
      s.mode.m_val = 0;
      file_storage::file_path(&file_path,fs,i,save_path);
      stat_file(&file_path,&s,ec,(file_status_flag_t)0x0);
      if (ec->failed_ == true) {
        set_error_impl(this,i,ec);
        lVar7 = -2;
      }
      else {
        set_cache_impl(this,i,s.file_size);
        lVar7 = s.file_size;
      }
      ::std::__cxx11::string::~string((string *)&file_path);
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
  }
  else {
    boost::system::error_code::assign
              (ec,2,&boost::system::detail::cat_holder<void>::system_category_instance.
                     super_error_category);
    lVar7 = -1;
  }
  return lVar7;
}

Assistant:

std::int64_t stat_cache::get_filesize(file_index_t const i, file_storage const& fs
		, std::string const& save_path, error_code& ec)
	{
		// always pretend symlinks don't exist, to trigger special logic for
		// creating and possibly validating them. There's a risk we'll and up in a
		// cycle of references here otherwise.
		// Should stat_file() be changed to use lstat()?
		if (fs.file_flags(i) & file_storage::flag_symlink)
		{
			ec.assign(boost::system::errc::no_such_file_or_directory, boost::system::system_category());
			return -1;
		}

		std::lock_guard<std::mutex> l(m_mutex);
		TORRENT_ASSERT(i < fs.end_file());
		if (i >= m_stat_cache.end_index()) m_stat_cache.resize(static_cast<int>(i) + 1
			, stat_cache_t{not_in_cache});
		std::int64_t sz = m_stat_cache[i].file_size;
		if (sz < not_in_cache)
		{
			ec = m_errors[std::size_t(-sz + file_error)];
			return file_error;
		}
		else if (sz == not_in_cache)
		{
			// query the filesystem
			file_status s;
			std::string const file_path = fs.file_path(i, save_path);
			stat_file(file_path, &s, ec);
			if (ec)
			{
				set_error_impl(i, ec);
				sz = file_error;
			}
			else
			{
				set_cache_impl(i, s.file_size);
				sz = s.file_size;
			}
		}
		return sz;
	}